

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::setIndexedBlendState
               (Functions *gl,BlendState *blend,deUint32 index)

{
  GLenum GVar1;
  GLenum GVar2;
  glColorMaskiFunc p_Var3;
  glBlendEquationiFunc p_Var4;
  glBlendEquationSeparateiFunc p_Var5;
  glBlendFunciFunc p_Var6;
  glBlendFuncSeparateiFunc p_Var7;
  GLuint GVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  GLenum GVar13;
  bool *pbVar14;
  Vector<bool,_4> *v;
  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *this;
  uint *puVar15;
  SeparateBlendEq *pSVar16;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  *this_00;
  BlendFunc *pBVar17;
  SeparateBlendFunc *pSVar18;
  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
  *blendFunc;
  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq> *blendEq;
  BVec4 mask;
  deUint32 index_local;
  BlendState *blend_local;
  Functions *gl_local;
  
  blendEq._4_4_ = index;
  _mask = blend;
  bVar9 = tcu::Maybe::operator_cast_to_bool((Maybe *)blend);
  if (bVar9) {
    pbVar14 = tcu::Maybe<bool>::operator*(&_mask->enableBlend);
    if ((*pbVar14 & 1U) == 0) {
      (*gl->disablei)(0xbe2,blendEq._4_4_);
    }
    else {
      (*gl->enablei)(0xbe2,blendEq._4_4_);
    }
  }
  bVar9 = tcu::Maybe::operator_cast_to_bool((Maybe *)&_mask->colorMask);
  if (bVar9) {
    v = tcu::Maybe<tcu::Vector<bool,_4>_>::operator*(&_mask->colorMask);
    tcu::Vector<bool,_4>::Vector((Vector<bool,_4> *)&blendEq,v);
    GVar8 = blendEq._4_4_;
    p_Var3 = gl->colorMaski;
    bVar9 = tcu::Vector<bool,_4>::x((Vector<bool,_4> *)&blendEq);
    bVar10 = tcu::Vector<bool,_4>::y((Vector<bool,_4> *)&blendEq);
    bVar11 = tcu::Vector<bool,_4>::z((Vector<bool,_4> *)&blendEq);
    bVar12 = tcu::Vector<bool,_4>::w((Vector<bool,_4> *)&blendEq);
    (*p_Var3)(GVar8,bVar9,bVar10,bVar11,bVar12);
  }
  bVar9 = tcu::Maybe::operator_cast_to_bool((Maybe *)&_mask->blendEq);
  if (bVar9) {
    this = tcu::
           Maybe<tcu::Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>_>
           ::operator*(&_mask->blendEq);
    bVar9 = tcu::
            Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>::
            is<unsigned_int>(this);
    GVar8 = blendEq._4_4_;
    if (bVar9) {
      p_Var4 = gl->blendEquationi;
      puVar15 = tcu::
                Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
                ::get<unsigned_int>(this);
      (*p_Var4)(GVar8,*puVar15);
    }
    else {
      bVar9 = tcu::
              Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
              ::is<deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>(this);
      GVar8 = blendEq._4_4_;
      if (bVar9) {
        p_Var5 = gl->blendEquationSeparatei;
        pSVar16 = tcu::
                  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
                  ::get<deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>(this);
        GVar13 = pSVar16->rgb;
        pSVar16 = tcu::
                  Either<unsigned_int,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>
                  ::get<deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendEq>(this);
        (*p_Var5)(GVar8,GVar13,pSVar16->alpha);
      }
    }
  }
  bVar9 = tcu::Maybe::operator_cast_to_bool((Maybe *)&_mask->blendFunc);
  if (bVar9) {
    this_00 = tcu::
              Maybe<tcu::Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>_>
              ::operator*(&_mask->blendFunc);
    bVar9 = tcu::
            Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
            ::is<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc>(this_00);
    GVar8 = blendEq._4_4_;
    if (bVar9) {
      p_Var6 = gl->blendFunci;
      pBVar17 = tcu::
                Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                ::get<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc>(this_00);
      GVar13 = pBVar17->src;
      pBVar17 = tcu::
                Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                ::get<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc>(this_00);
      (*p_Var6)(GVar8,GVar13,pBVar17->dst);
    }
    else {
      bVar9 = tcu::
              Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
              ::is<deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>(this_00);
      GVar8 = blendEq._4_4_;
      if (bVar9) {
        p_Var7 = gl->blendFuncSeparatei;
        pSVar18 = tcu::
                  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                  ::get<deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>(this_00)
        ;
        GVar13 = (pSVar18->rgb).src;
        pSVar18 = tcu::
                  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                  ::get<deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>(this_00)
        ;
        GVar1 = (pSVar18->rgb).dst;
        pSVar18 = tcu::
                  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                  ::get<deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>(this_00)
        ;
        GVar2 = (pSVar18->alpha).src;
        pSVar18 = tcu::
                  Either<deqp::gles31::Functional::(anonymous_namespace)::BlendFunc,_deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>
                  ::get<deqp::gles31::Functional::(anonymous_namespace)::SeparateBlendFunc>(this_00)
        ;
        (*p_Var7)(GVar8,GVar13,GVar1,GVar2,(pSVar18->alpha).dst);
      }
    }
  }
  GVar13 = (*gl->getError)();
  glu::checkError(GVar13,"Failed to set draw buffer specifig blend state.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDrawBuffersIndexedTests.cpp"
                  ,0x10e);
  return;
}

Assistant:

void setIndexedBlendState (const glw::Functions& gl, const BlendState& blend, deUint32 index)
{
	if (blend.enableBlend)
	{
		if (*blend.enableBlend)
			gl.enablei(GL_BLEND, index);
		else
			gl.disablei(GL_BLEND, index);
	}

	if (blend.colorMask)
	{
		const BVec4 mask = *blend.colorMask;

		gl.colorMaski(index, mask.x(), mask.y(), mask.z(), mask.w());
	}

	if (blend.blendEq)
	{
		const Either<BlendEq, SeparateBlendEq>& blendEq = *blend.blendEq;

		if (blendEq.is<BlendEq>())
			gl.blendEquationi(index, blendEq.get<BlendEq>());
		else if (blendEq.is<SeparateBlendEq>())
			gl.blendEquationSeparatei(index, blendEq.get<SeparateBlendEq>().rgb, blendEq.get<SeparateBlendEq>().alpha);
		else
			DE_ASSERT(false);
	}

	if (blend.blendFunc)
	{
		const Either<BlendFunc, SeparateBlendFunc>& blendFunc = *blend.blendFunc;

		if (blendFunc.is<BlendFunc>())
			gl.blendFunci(index, blendFunc.get<BlendFunc>().src, blendFunc.get<BlendFunc>().dst);
		else if (blendFunc.is<SeparateBlendFunc>())
			gl.blendFuncSeparatei(index, blendFunc.get<SeparateBlendFunc>().rgb.src, blendFunc.get<SeparateBlendFunc>().rgb.dst, blendFunc.get<SeparateBlendFunc>().alpha.src, blendFunc.get<SeparateBlendFunc>().alpha.dst);
		else
			DE_ASSERT(false);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to set draw buffer specifig blend state.");
}